

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gillespie.cpp
# Opt level: O2

double __thiscall Gillespie::IndexUpdatePropensity(Gillespie *this,Ptr *reaction,int index)

{
  pointer pdVar1;
  double extraout_XMM0_Qa;
  
  (**((reaction->super___shared_ptr<Reaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Reaction)
            ();
  pdVar1 = (this->alpha_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1[index] = pdVar1[index] + extraout_XMM0_Qa;
  return extraout_XMM0_Qa;
}

Assistant:

double Gillespie::IndexUpdatePropensity(Reaction::Ptr reaction, int index) {
  double alpha_diff = reaction->CalculatePropensity();
  alpha_list_[index] += alpha_diff;
 
  // alpha_sum_ += alpha_diff;
  return alpha_diff;
}